

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsTest.cpp
# Opt level: O1

void Generate(mt19937 *rng,vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer)

{
  pointer puVar1;
  result_type rVar2;
  uint uVar3;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  double dVar4;
  uniform_int_distribution<unsigned_int> ud;
  uchar local_31;
  param_type local_30;
  
  dVar4 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (rng);
  dVar4 = dVar4 + 0.0;
  uVar3 = (int)(long)(dVar4 * dVar4 * dVar4 * 4194303.0) + 1;
  puVar1 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(buffer,(ulong)uVar3);
  local_30._M_a = 0;
  local_30._M_b = 0xff;
  if (uVar3 != 0) {
    do {
      rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                        ((uniform_int_distribution<unsigned_int> *)&local_30,rng,&local_30);
      local_31 = (uchar)rVar2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (buffer,&local_31);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

static void Generate(std::mt19937 & rng, std::vector<uint8_t> & buffer)
{
	// Fill up a test buffer of random size with random data. 
	auto rndVal = std::uniform_real_distribution<double>(0.0, 1.0f)(rng);
	auto size = static_cast<uint32_t>((rndVal * rndVal * rndVal) * (MAX_PAYLOAD_SIZE - MIN_PAYLOAD_SIZE)) + MIN_PAYLOAD_SIZE;
	buffer.clear();
	buffer.reserve(size);
	auto ud = std::uniform_int_distribution<uint32_t>(0, 255);
	for (uint32_t i = 0; i < size; ++i)
		buffer.push_back(static_cast<uint8_t>(ud(rng)));
}